

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRT_builder_main.cpp
# Opt level: O0

void writeErrors(string *description,vector<CError,_std::allocator<CError>_> *errors)

{
  bool bVar1;
  ostream *poVar2;
  reference pCVar3;
  string *psVar4;
  PositionInfo local_80 [2];
  undefined1 local_60 [8];
  CError error;
  const_iterator __end1;
  const_iterator __begin1;
  vector<CError,_std::allocator<CError>_> *__range1;
  vector<CError,_std::allocator<CError>_> *errors_local;
  string *description_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)description);
  std::operator<<(poVar2,"\n");
  __end1 = std::vector<CError,_std::allocator<CError>_>::begin(errors);
  error.position._8_8_ = std::vector<CError,_std::allocator<CError>_>::end(errors);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_CError_*,_std::vector<CError,_std::allocator<CError>_>_>
                                *)&error.position.firstColumn);
    if (!bVar1) break;
    pCVar3 = __gnu_cxx::
             __normal_iterator<const_CError_*,_std::vector<CError,_std::allocator<CError>_>_>::
             operator*(&__end1);
    CError::CError((CError *)local_60,pCVar3);
    CError::GetPosition((CError *)local_60);
    PositionInfo::GetStringPosition_abi_cxx11_(local_80);
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_80);
    poVar2 = std::operator<<(poVar2," ");
    psVar4 = CError::GetMessage_abi_cxx11_((CError *)local_60);
    poVar2 = std::operator<<(poVar2,(string *)psVar4);
    std::operator<<(poVar2,"\n");
    std::__cxx11::string::~string((string *)local_80);
    CError::~CError((CError *)local_60);
    __gnu_cxx::__normal_iterator<const_CError_*,_std::vector<CError,_std::allocator<CError>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void writeErrors( const std::string &description, const std::vector<CError> &errors ) {
    std::cout << description << "\n";

    for ( auto error : errors ) {
        std::cout << error.GetPosition( ).GetStringPosition( ) << " " << error.GetMessage( ) << "\n";
    }
}